

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::emitPlyMesh(SemanticParser *this,SP *shape)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  reference pvVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SP SVar5;
  vec3f vVar6;
  vec3f *v_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *__range1_1;
  vec3f *v;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *__range1;
  affine3f xfm;
  SP ours;
  string fileName;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  shared_ptr<pbrt::Shape> *this_00;
  Scene *in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdd8 [16];
  shared_ptr<pbrt::Material> *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined1 in_stack_fffffffffffffdf8 [16];
  vec3f *in_stack_fffffffffffffe08;
  SP *in_stack_fffffffffffffe10;
  affine3f *m;
  SemanticParser *in_stack_fffffffffffffe18;
  element_type *in_stack_fffffffffffffe80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe88;
  SemanticParser *in_stack_fffffffffffffe90;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  in_stack_fffffffffffffec0;
  ParamSet *in_stack_fffffffffffffec8;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  local_100;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_f8;
  undefined1 local_f0 [80];
  undefined1 local_a0 [40];
  string local_78 [8];
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *in_stack_ffffffffffffff90;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *in_stack_ffffffffffffff98;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_stack_ffffffffffffffa0;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  string local_38 [56];
  
  std::__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x19f8f3);
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x19f908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf8._8_8_,in_stack_fffffffffffffdf8._0_8_,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  syntactic::ParamSet::getParamString
            (in_stack_fffffffffffffec8,(string *)in_stack_fffffffffffffec0._M_current);
  syntactic::Scene::makeGlobalFileName(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0x27));
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x19f9b9);
  std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Material> *)in_stack_fffffffffffffdc0,
             (shared_ptr<pbrt::syntactic::Material> *)in_stack_fffffffffffffdb8);
  findOrCreateMaterial(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::make_shared<pbrt::TriangleMesh,std::shared_ptr<pbrt::Material>>(in_stack_fffffffffffffde8);
  std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x19fa12);
  std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Material> *)0x19fa1f);
  m = (affine3f *)local_a0;
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x19fa31);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x19fa44);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x19fa59);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x19fa6e);
  pbrt::ply::parse(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  peVar2 = std::
           __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x19faa3);
  memcpy(local_f0,&peVar2->transform,0x30);
  peVar3 = std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x19fac9);
  local_f8 = &peVar3->vertex;
  local_100._M_current =
       (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::begin
                          (in_stack_fffffffffffffdb8);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::end(in_stack_fffffffffffffdb8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (!bVar1) break;
    pvVar4 = __gnu_cxx::
             __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
             ::operator*(&local_100);
    vVar6 = math::xfmPoint(in_stack_fffffffffffffdd8._8_8_,in_stack_fffffffffffffdd8._0_8_);
    pvVar4->x = (float)(int)vVar6._0_8_;
    pvVar4->y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
    pvVar4->z = vVar6.z;
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
    ::operator++(&local_100);
  }
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x19fc99);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::begin
            (in_stack_fffffffffffffdb8);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::end(in_stack_fffffffffffffdb8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (!bVar1) break;
    pvVar4 = __gnu_cxx::
             __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
             ::operator*((__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                          *)&stack0xfffffffffffffec0);
    vVar6 = math::xfmNormal(m,in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe90 = vVar6._0_8_;
    *(SemanticParser **)pvVar4 = in_stack_fffffffffffffe90;
    pvVar4->z = vVar6.z;
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
    ::operator++((__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                  *)&stack0xfffffffffffffec0);
  }
  this_00 = (shared_ptr<pbrt::Shape> *)&stack0xfffffffffffffe80;
  std::shared_ptr<pbrt::Shape>::shared_ptr<pbrt::TriangleMesh,void>
            (this_00,(shared_ptr<pbrt::TriangleMesh> *)in_stack_fffffffffffffdb8);
  std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)this_00,
             (shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffdb8);
  extractTextures(in_stack_fffffffffffffe90,(SP *)in_stack_fffffffffffffe88._M_pi,
                  (SP *)in_stack_fffffffffffffe80);
  std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)0x19fdea);
  std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x19fdf7);
  std::shared_ptr<pbrt::Shape>::shared_ptr<pbrt::TriangleMesh,void>
            (this_00,(shared_ptr<pbrt::TriangleMesh> *)in_stack_fffffffffffffdb8);
  std::shared_ptr<pbrt::TriangleMesh>::~shared_ptr((shared_ptr<pbrt::TriangleMesh> *)0x19fe19);
  std::__cxx11::string::~string(local_38);
  SVar5.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar5.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitPlyMesh(pbrt::syntactic::Shape::SP shape)
  {
    const std::string fileName
      = pbrtScene->makeGlobalFileName(shape->getParamString("filename"));
    TriangleMesh::SP ours = std::make_shared<TriangleMesh>(findOrCreateMaterial(shape->material));
    ply::parse(fileName,ours->vertex,ours->normal,ours->texcoord,ours->index);

    affine3f xfm = shape->transform.atStart;
    for (vec3f &v : ours->vertex)
      v = xfmPoint(xfm,v);
    for (vec3f &v : ours->normal)
      v = xfmNormal(xfm,v);

    extractTextures(ours,shape);
    return ours;
  }